

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

int raplcap_msr_pd_set_zone_clamped
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,int clamped)

{
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  int *piVar3;
  off_t msr;
  uint64_t msrval;
  int local_3c;
  uint64_t local_38;
  
  local_3c = clamped;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    msr = -1;
  }
  iVar2 = -1;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&local_38,pkg,die,msr);
    if (iVar1 == 0) {
      local_38 = msr_set_zone_clamped(&ctx->ctx,zone,local_38,&local_3c,&local_3c);
      iVar2 = msr_sys_write(ctx->sys,local_38,pkg,die,msr);
    }
  }
  return iVar2;
}

Assistant:

int raplcap_msr_pd_set_zone_clamped(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone, int clamped) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_set_zone_clamped: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  msrval = msr_set_zone_clamped(&state->ctx, zone, msrval, &clamped, &clamped);
  return msr_sys_write(state->sys, msrval, pkg, die, msr);
}